

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_ClassArray<ON_CurveProxyHistory> * __thiscall
ON_ClassArray<ON_CurveProxyHistory>::operator=
          (ON_ClassArray<ON_CurveProxyHistory> *this,ON_ClassArray<ON_CurveProxyHistory> *src)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if (this->m_a != (ON_CurveProxyHistory *)0x0) {
        iVar1 = src->m_count;
        this->m_count = iVar1;
        lVar3 = 0;
        for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
          ON_CurveProxyHistory::operator=
                    ((ON_CurveProxyHistory *)((this->m_a->m_curve_ref).m_uuid.Data4 + lVar3 + -8),
                     (ON_CurveProxyHistory *)((src->m_a->m_curve_ref).m_uuid.Data4 + lVar3 + -8));
          iVar1 = this->m_count;
          lVar3 = lVar3 + 0x158;
        }
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}